

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void xmrig::Buffer::toHex(uint8_t *in,size_t size,uint8_t *out)

{
  size_t i;
  byte bVar1;
  uint8_t uVar2;
  
  for (i = 0; size != i; i = i + 1) {
    bVar1 = in[i] >> 4;
    uVar2 = bVar1 + 0x57;
    if (in[i] < 0xa0) {
      uVar2 = bVar1 + 0x30;
    }
    out[i * 2] = uVar2;
    bVar1 = in[i] & 0xf;
    uVar2 = bVar1 + 0x57;
    if (bVar1 < 10) {
      uVar2 = bVar1 + 0x30;
    }
    out[i * 2 + 1] = uVar2;
  }
  return;
}

Assistant:

void xmrig::Buffer::toHex(const uint8_t *in, size_t size, uint8_t *out)
{
    for (size_t i = 0; i < size; i++) {
        out[i * 2]     = hf_bin2hex((in[i] & 0xF0) >> 4);
        out[i * 2 + 1] = hf_bin2hex(in[i] & 0x0F);
    }
}